

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smf.c
# Opt level: O3

void smf_track_remove_from_smf(smf_track_t *track)

{
  bool bVar1;
  smf_track_t *track_00;
  smf_event_t *psVar2;
  int event_number;
  smf_t *psVar3;
  int track_number;
  
  psVar3 = track->smf;
  if (psVar3 == (smf_t *)0x0) {
    __assert_fail("track->smf != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/davidhsilaban[P]munt/mt32emu_smf2wav/libsmf/src/smf.c"
                  ,0xb3,"void smf_track_remove_from_smf(smf_track_t *)");
  }
  psVar3->number_of_tracks = psVar3->number_of_tracks + -1;
  if (psVar3->tracks_array != (GPtrArray *)0x0) {
    g_ptr_array_remove(psVar3->tracks_array,track);
    psVar3 = track->smf;
    track_number = track->track_number;
    if (track->track_number <= psVar3->number_of_tracks) {
      do {
        track_00 = smf_get_track_by_number(psVar3,track_number);
        track_00->track_number = track_number;
        if (0 < track_00->number_of_events) {
          event_number = 0;
          do {
            event_number = event_number + 1;
            psVar2 = smf_track_get_event_by_number(track_00,event_number);
            psVar2->track_number = track_number;
          } while (event_number < track_00->number_of_events);
        }
        psVar3 = track->smf;
        bVar1 = track_number < psVar3->number_of_tracks;
        track_number = track_number + 1;
      } while (bVar1);
    }
    track->track_number = -1;
    track->smf = (smf_t *)0x0;
    return;
  }
  __assert_fail("track->smf->tracks_array",
                "/workspace/llm4binary/github/license_all_cmakelists_25/davidhsilaban[P]munt/mt32emu_smf2wav/libsmf/src/smf.c"
                ,0xb7,"void smf_track_remove_from_smf(smf_track_t *)");
}

Assistant:

void
smf_track_remove_from_smf(smf_track_t *track)
{
	int i, j;
	smf_track_t *tmp;
	smf_event_t *ev;

	assert(track->smf != NULL);

	track->smf->number_of_tracks--;

	assert(track->smf->tracks_array);
	g_ptr_array_remove(track->smf->tracks_array, track);

	/* Renumber the rest of the tracks, so they are consecutively numbered. */
	for (i = track->track_number; i <= track->smf->number_of_tracks; i++) {
		tmp = smf_get_track_by_number(track->smf, i);
		tmp->track_number = i;

		/*
		 * Events have track numbers too.  I guess this wasn't a wise
		 * decision.  ;-/
		 */
		for (j = 1; j <= tmp->number_of_events; j++) {
			ev = smf_track_get_event_by_number(tmp, j);
			ev->track_number = i;
		}
	}

	track->track_number = -1;
	track->smf = NULL;
}